

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call-utils.h
# Opt level: O0

Expression *
wasm::CallUtils::convertToDirectCalls<wasm::CallRef>
          (CallRef *curr,
          function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
          *getCallInfo,Function *func,Module *wasm)

{
  Expression *condition;
  IndirectCallInfo info;
  IndirectCallInfo info_00;
  Expression *ifTrue;
  bool bVar1;
  Select *pSVar2;
  add_pointer_t<wasm::CallUtils::Unknown> ptVar3;
  _Manager_type *this;
  Expression **ppEVar4;
  Expression *ifFalse;
  Iterator IVar5;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  byte local_221;
  undefined1 local_210 [12];
  If *local_200 [2];
  undefined1 local_1f0 [12];
  If *local_1e0;
  If *iff;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  Expression *local_1c0;
  Expression *ifFalseCall;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  Expression *local_198;
  Expression *ifTrueCall;
  anon_class_32_4_0b90e1b8 makeCall;
  anon_class_32_4_bf8fb625 getOperands;
  size_t numOperands;
  uintptr_t local_140;
  Index local_134;
  Expression *pEStack_130;
  Index currLocal;
  Expression *operand_1;
  Iterator __end0_1;
  undefined1 local_108 [8];
  Iterator __begin0_1;
  ExpressionList *__range2_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operandLocals;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> blockContents;
  Builder builder;
  BasicType local_ac;
  Expression *local_a8;
  Expression *operand;
  Iterator __end0;
  Iterator __begin0;
  ExpressionList *__range2;
  ExpressionList *operands;
  variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known> ifFalseCallInfo;
  variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known> ifTrueCallInfo;
  Select *select;
  Module *wasm_local;
  Function *func_local;
  function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
  *getCallInfo_local;
  CallRef *curr_local;
  
  getCallInfo_local =
       (function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
        *)curr;
  pSVar2 = Expression::dynCast<wasm::Select>(curr->target);
  if (pSVar2 != (Select *)0x0) {
    ifTrueCallInfo.
    super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>.
    super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
    .
    super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
    .super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
    .super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
    .
    super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
    ._20_4_ = 1;
    bVar1 = wasm::Type::operator==
                      (&(pSVar2->super_SpecificExpression<(wasm::Expression::Id)17>).
                        super_Expression.type,
                       (BasicType *)
                       ((long)&ifTrueCallInfo.
                               super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                               .
                               super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                               .
                               super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                               .
                               super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                               .
                               super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                               .
                               super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                       + 0x14));
    if (!bVar1) {
      std::
      function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
      ::operator()((variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                    *)((long)&ifFalseCallInfo.
                              super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                              .
                              super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                              .
                              super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                              .
                              super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                              .
                              super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                              .
                              super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      + 0x10),getCallInfo,pSVar2->ifTrue);
      std::
      function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
      ::operator()((variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                    *)&operands,getCallInfo,pSVar2->ifFalse);
      ptVar3 = std::
               get_if<wasm::CallUtils::Unknown,wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>
                         ((variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                           *)((long)&ifFalseCallInfo.
                                     super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                                     .
                                     super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                                     .
                                     super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                                     .
                                     super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                                     .
                                     super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                                     .
                                     super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                             + 0x10));
      if ((ptVar3 == (add_pointer_t<wasm::CallUtils::Unknown>)0x0) &&
         (ptVar3 = std::
                   get_if<wasm::CallUtils::Unknown,wasm::CallUtils::Unknown,wasm::CallUtils::Trap,wasm::CallUtils::Known>
                             ((variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                               *)&operands), ptVar3 == (add_pointer_t<wasm::CallUtils::Unknown>)0x0)
         ) {
        this = &(getCallInfo_local->super__Function_base)._M_manager;
        join_0x00000010_0x00000000_ =
             ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this
                       );
        _operand = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                             ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               *)this);
        while( true ) {
          bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator!=((Iterator *)&__end0.index,(Iterator *)&operand);
          if (!bVar1) {
            Builder::Builder((Builder *)
                             &blockContents.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,wasm);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                       &operandLocals.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1);
            __begin0_1.index = (size_t)this;
            IVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)this);
            __begin0_1.parent = (ArenaVector<wasm::Expression_*> *)IVar5.index;
            local_108 = (undefined1  [8])IVar5.parent;
            IVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)__begin0_1.index);
            while( true ) {
              __end0_1.parent = (ArenaVector<wasm::Expression_*> *)IVar5.index;
              operand_1 = (Expression *)IVar5.parent;
              bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator
                      ::operator!=((Iterator *)local_108,(Iterator *)&operand_1);
              if (!bVar1) break;
              ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                        Iterator::operator*((Iterator *)local_108);
              pEStack_130 = *ppEVar4;
              local_140 = (pEStack_130->type).id;
              local_134 = Builder::addVar(func,(Type)local_140);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1,
                         &local_134);
              numOperands = (size_t)Builder::makeLocalSet
                                              ((Builder *)
                                               &blockContents.
                                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                               local_134,pEStack_130);
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         &operandLocals.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(value_type *)&numOperands);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator++((Iterator *)local_108);
              IVar5.index = (size_t)__end0_1.parent;
              IVar5.parent = (ArenaVector<wasm::Expression_*> *)operand_1;
            }
            getOperands.operands =
                 (ExpressionList *)
                 ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                            this);
            makeCall.func = (Function *)&getOperands.operands;
            ifTrueCall = (Expression *)
                         &blockContents.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
            getOperands.builder = (Builder *)&__range2_1;
            makeCall.builder = (Builder *)&makeCall.func;
            makeCall.getOperands = (anon_class_32_4_bf8fb625 *)&getCallInfo_local;
            local_1a8 = ifTrueCallInfo.
                        super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                        .
                        super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                        .
                        super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                        .
                        super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                        .
                        super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                        .
                        super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                        ._M_u._8_8_;
            ifFalseCall = (Expression *)
                          ifFalseCallInfo.
                          super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          ._16_8_;
            uStack_1b0 = ifTrueCallInfo.
                         super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         ._M_u._0_8_;
            info.
            super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            ._M_u._8_8_ = ifTrueCallInfo.
                          super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          ._M_u._0_8_;
            info.
            super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            ._M_u._0_8_ = ifFalseCallInfo.
                          super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          ._16_8_;
            info.
            super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            ._16_8_ = ifTrueCallInfo.
                      super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      .
                      super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      .
                      super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      .
                      super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      .
                      super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      .
                      super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      ._M_u._8_8_;
            makeCall.curr = (CallRef **)func;
            getOperands.numOperands = (size_t *)ifTrueCall;
            getOperands.operandLocals = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
            local_198 = convertToDirectCalls<wasm::CallRef>::anon_class_32_4_0b90e1b8::operator()
                                  ((anon_class_32_4_0b90e1b8 *)&ifTrueCall,info);
            local_1c8 = ifFalseCallInfo.
                        super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                        .
                        super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                        .
                        super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                        .
                        super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                        .
                        super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                        .
                        super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                        ._M_u._8_8_;
            iff = (If *)operands;
            uStack_1d0 = ifFalseCallInfo.
                         super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         .
                         super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                         ._M_u._0_8_;
            info_00.
            super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            ._M_u._8_8_ = ifFalseCallInfo.
                          super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          .
                          super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                          ._M_u._0_8_;
            info_00.
            super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            ._M_u._0_8_ = operands;
            info_00.
            super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            .
            super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
            ._16_8_ = ifFalseCallInfo.
                      super__Variant_base<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      .
                      super__Move_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      .
                      super__Copy_assign_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      .
                      super__Move_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      .
                      super__Copy_ctor_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      .
                      super__Variant_storage_alias<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>
                      ._M_u._8_8_;
            ifFalse = convertToDirectCalls<wasm::CallRef>::anon_class_32_4_0b90e1b8::operator()
                                ((anon_class_32_4_0b90e1b8 *)&ifTrueCall,info_00);
            ifTrue = local_198;
            condition = pSVar2->condition;
            local_1c0 = ifFalse;
            std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_1f0);
            type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._12_4_ = 0;
            type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 (_Storage<wasm::Type,_true>)local_1f0._0_8_;
            type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_1f0[8];
            type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._9_3_ = local_1f0._9_3_;
            local_200[0] = Builder::makeIf((Builder *)
                                           &blockContents.
                                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                           condition,ifTrue,ifFalse,type_00);
            local_1e0 = local_200[0];
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                       &operandLocals.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(value_type *)local_200);
            std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_210);
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._12_4_ = 0;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload =
                 (_Storage<wasm::Type,_true>)local_210._0_8_;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_210[8];
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._9_3_ = local_210._9_3_;
            curr_local = (CallRef *)
                         Builder::
                         makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                                   ((Builder *)
                                    &blockContents.
                                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                     *)&operandLocals.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,type);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2_1);
            std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                       &operandLocals.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            return (Expression *)curr_local;
          }
          ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                    operator*((Iterator *)&__end0.index);
          local_a8 = *ppEVar4;
          local_ac = unreachable;
          bVar1 = wasm::Type::operator==(&local_a8->type,&local_ac);
          local_221 = 1;
          if (!bVar1) {
            bVar1 = TypeUpdating::canHandleAsLocal((Type)(local_a8->type).id);
            local_221 = bVar1 ^ 0xff;
          }
          if ((local_221 & 1) != 0) break;
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                    ((Iterator *)&__end0.index);
        }
        return (Expression *)0x0;
      }
    }
  }
  return (Expression *)0x0;
}

Assistant:

inline Expression*
convertToDirectCalls(T* curr,
                     std::function<IndirectCallInfo(Expression*)> getCallInfo,
                     Function& func,
                     Module& wasm) {
  auto* select = curr->target->template dynCast<Select>();
  if (!select) {
    return nullptr;
  }

  if (select->type == Type::unreachable) {
    // Leave this for DCE.
    return nullptr;
  }

  // Check if we can find useful info for both arms: either known call targets,
  // or traps.
  // TODO: support more than 2 targets (with nested selects)
  auto ifTrueCallInfo = getCallInfo(select->ifTrue);
  auto ifFalseCallInfo = getCallInfo(select->ifFalse);
  if (std::get_if<Unknown>(&ifTrueCallInfo) ||
      std::get_if<Unknown>(&ifFalseCallInfo)) {
    // We know nothing about at least one arm, so give up.
    // TODO: Perhaps emitting a direct call for one arm is enough even if the
    //       other remains indirect?
    return nullptr;
  }

  auto& operands = curr->operands;

  // We must use the operands twice, and also must move the condition to
  // execute first, so we'll use locals for them all. First, see if any are
  // unreachable, and if so stop trying to optimize and leave this for DCE.
  for (auto* operand : operands) {
    if (operand->type == Type::unreachable ||
        !TypeUpdating::canHandleAsLocal(operand->type)) {
      return nullptr;
    }
  }

  Builder builder(wasm);
  std::vector<Expression*> blockContents;

  // None of the types are a problem, so we can proceed to add new vars as
  // needed and perform this optimization.
  std::vector<Index> operandLocals;
  for (auto* operand : operands) {
    auto currLocal = builder.addVar(&func, operand->type);
    operandLocals.push_back(currLocal);
    blockContents.push_back(builder.makeLocalSet(currLocal, operand));
  }

  // Build the calls.
  auto numOperands = operands.size();
  auto getOperands = [&]() {
    std::vector<Expression*> newOperands(numOperands);
    for (Index i = 0; i < numOperands; i++) {
      newOperands[i] =
        builder.makeLocalGet(operandLocals[i], operands[i]->type);
    }
    return newOperands;
  };

  auto makeCall = [&](IndirectCallInfo info) -> Expression* {
    Expression* ret;
    if (std::get_if<Trap>(&info)) {
      ret = builder.makeUnreachable();
    } else {
      ret = builder.makeCall(std::get<Known>(info).target,
                             getOperands(),
                             curr->type,
                             curr->isReturn);
    }
    debuginfo::copyOriginalToReplacement(curr, ret, &func);
    return ret;
  };
  auto* ifTrueCall = makeCall(ifTrueCallInfo);
  auto* ifFalseCall = makeCall(ifFalseCallInfo);

  // Create the if to pick the calls, and emit the final block.
  auto* iff = builder.makeIf(select->condition, ifTrueCall, ifFalseCall);
  blockContents.push_back(iff);
  return builder.makeBlock(blockContents);
}